

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintDocType(TidyDocImpl *doc,uint indent,Node *node)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  TidyPrintImpl *pprint_00;
  AttVal *pAVar4;
  AttVal *pAVar5;
  int local_50;
  uint local_44;
  uint i;
  AttVal *sys;
  AttVal *fpi;
  uint spaces;
  uint wraplen;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  pprint_00 = &doc->pprint;
  uVar1 = (doc->config).value[0x5d].v;
  local_50 = (int)(doc->config).value[0x26].v;
  pAVar4 = prvTidyGetAttrByName(node,"PUBLIC");
  pAVar5 = prvTidyGetAttrByName(node,"SYSTEM");
  SetWrap(doc,indent);
  PCondFlushLineSmart(doc,indent);
  AddString(pprint_00,"<!DOCTYPE ");
  SetWrap(doc,indent);
  if (node->element != (tmbstr)0x0) {
    AddString(pprint_00,node->element);
  }
  if ((pAVar4 != (AttVal *)0x0) && (pAVar4->value != (tmbstr)0x0)) {
    AddString(pprint_00," PUBLIC ");
    AddChar(pprint_00,pAVar4->delim);
    AddString(pprint_00,pAVar4->value);
    AddChar(pprint_00,pAVar4->delim);
  }
  if ((((pAVar4 == (AttVal *)0x0) || (pAVar4->value == (tmbstr)0x0)) || (pAVar5 == (AttVal *)0x0))
     || (pAVar5->value == (tmbstr)0x0)) {
    if ((pAVar5 != (AttVal *)0x0) && (pAVar5->value != (tmbstr)0x0)) {
      AddString(pprint_00," SYSTEM ");
    }
    goto LAB_0015e23c;
  }
  uVar3 = (doc->pprint).linelen;
  uVar2 = prvTidytmbstrlen(pAVar5->value);
  local_44 = (uVar3 - (uVar2 + 2)) - 1;
  if ((local_44 == 0) ||
     (uVar3 = prvTidytmbstrlen(pAVar5->value), (uint)uVar1 <= uVar3 + 2 + local_44)) {
LAB_0015e1eb:
    local_44 = 0;
  }
  else {
    if (local_50 == 0) {
      local_50 = 2;
    }
    if ((uint)(local_50 * 2) < local_44) goto LAB_0015e1eb;
  }
  PCondFlushLineSmart(doc,local_44);
  if ((doc->pprint).linelen != 0) {
    AddChar(pprint_00,0x20);
  }
LAB_0015e23c:
  if ((pAVar5 != (AttVal *)0x0) && (pAVar5->value != (tmbstr)0x0)) {
    AddChar(pprint_00,pAVar5->delim);
    AddString(pprint_00,pAVar5->value);
    AddChar(pprint_00,pAVar5->delim);
  }
  if (node->content != (Node *)0x0) {
    PCondFlushLineSmart(doc,indent);
    AddChar(pprint_00,0x5b);
    PPrintText(doc,0x10,0,node->content);
    AddChar(pprint_00,0x5d);
  }
  SetWrap(doc,0);
  AddChar(pprint_00,0x3e);
  PCondFlushLineSmart(doc,indent);
  return;
}

Assistant:

static void PPrintDocType( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint wraplen = cfg( doc, TidyWrapLen );
    uint spaces = cfg( doc, TidyIndentSpaces );
    AttVal* fpi = TY_(GetAttrByName)(node, "PUBLIC");
    AttVal* sys = TY_(GetAttrByName)(node, "SYSTEM");

    /* todo: handle non-ASCII characters in FPI / SI / node->element */

    SetWrap( doc, indent );
    PCondFlushLineSmart( doc, indent );

    AddString( pprint, "<!DOCTYPE " );
    SetWrap( doc, indent );
    if (node->element)
    {
        AddString(pprint, node->element);
    }

    if (fpi && fpi->value)
    {
        AddString(pprint, " PUBLIC ");
        AddChar(pprint, fpi->delim);
        AddString(pprint, fpi->value);
        AddChar(pprint, fpi->delim);
    }

    if (fpi && fpi->value && sys && sys->value)
    {
        uint i = pprint->linelen - (TY_(tmbstrlen)(sys->value) + 2) - 1;
        if (!(i>0&&TY_(tmbstrlen)(sys->value)+2+i<wraplen&&i<=(spaces?spaces:2)*2))
            i = 0;

        PCondFlushLineSmart(doc, i);
        if (pprint->linelen)
            AddChar(pprint, ' ');
    }
    else if (sys && sys->value)
    {
        AddString(pprint, " SYSTEM ");
    }

    if (sys && sys->value)
    {
        AddChar(pprint, sys->delim);
        AddString(pprint, sys->value);
        AddChar(pprint, sys->delim);
    }

    if (node->content)
    {
        PCondFlushLineSmart(doc, indent);
        AddChar(pprint, '[');
        PPrintText(doc, CDATA, 0, node->content);
        AddChar(pprint, ']');
    }

    SetWrap( doc, 0 );
    AddChar( pprint, '>' );
    PCondFlushLineSmart( doc, indent );
}